

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::DSPOMDP::Copy
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          DSPOMDP *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppSVar4;
  undefined4 extraout_var;
  value_type local_30;
  int local_28;
  undefined1 local_21;
  int i;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  DSPOMDP *this_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *copy;
  
  local_21 = 0;
  _i = particles;
  particles_local = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this;
  this_local = (DSPOMDP *)__return_storage_ptr__;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
  for (local_28 = 0; uVar2 = (ulong)local_28,
      sVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(_i),
      uVar2 < sVar3; local_28 = local_28 + 1) {
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (_i,(long)local_28);
    iVar1 = (*this->_vptr_DSPOMDP[0x16])(this,*ppSVar4);
    local_30 = (value_type)CONCAT44(extraout_var,iVar1);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              (__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> DSPOMDP::Copy(const vector<State*>& particles) const {
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++)
		copy.push_back(Copy(particles[i]));
	return copy;
}